

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O2

void __thiscall
AdvancedMipsGenerator::Transform2REG(AdvancedMipsGenerator *this,string *in,string *out)

{
  bool bVar1;
  __type _Var2;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = REGJudge(this,in);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)out);
    return;
  }
  std::__cxx11::string::string((string *)&local_40,"$v0",&local_41);
  _Var2 = std::operator==(in,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (_Var2) {
    std::__cxx11::string::assign((char *)out);
  }
  return;
}

Assistant:

void AdvancedMipsGenerator::Transform2REG(const string& in, string& out) {
    if (REGJudge(in)) {
        out = in;
    } else if (in == V0_REG) {
        out = "$v0";
    }
}